

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void wabt::WriteType(Stream *stream,Type type,char *desc)

{
  Index value;
  Enum value_00;
  Type local_58;
  string local_50;
  
  value_00 = type.enum_;
  local_58 = type;
  if (desc == (char *)0x0) {
    Type::GetName_abi_cxx11_(&local_50,&local_58);
    WriteS32Leb128(stream,value_00,local_50._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    value_00 = local_58.enum_;
  }
  else {
    WriteS32Leb128(stream,value_00,desc);
  }
  if (value_00 == Reference) {
    value = Type::GetReferenceIndex(&local_58);
    if (desc == (char *)0x0) {
      Type::GetName_abi_cxx11_(&local_50,&local_58);
      WriteS32Leb128(stream,value,local_50._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
    }
    else {
      WriteS32Leb128(stream,value,desc);
    }
  }
  return;
}

Assistant:

void WriteType(Stream* stream, Type type, const char* desc) {
  WriteS32Leb128(stream, type, desc ? desc : type.GetName().c_str());
  if (type.IsReferenceWithIndex()) {
    WriteS32Leb128(stream, type.GetReferenceIndex(),
                   desc ? desc : type.GetName().c_str());
  }
}